

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O1

void __thiscall S1Interval::AddPoint(S1Interval *this,double p)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  S2LogMessage SStack_58;
  double local_48;
  undefined8 uStack_40;
  S2LogMessage local_30;
  
  if (3.141592653589793 < ABS(p)) {
    S2LogMessage::S2LogMessage
              (&SStack_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
               ,0xa5,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_58.stream_,"Check failed: (fabs(p)) <= (3.14159265358979323846) ",0x34);
    goto LAB_0019e37b;
  }
  dVar7 = (double)(~-(ulong)(p != -3.141592653589793) & 0x400921fb54442d18 |
                  -(ulong)(p != -3.141592653589793) & (ulong)p);
  dVar1 = (this->bounds_).c_[0];
  dVar2 = (this->bounds_).c_[1];
  if (dVar1 <= dVar2) {
    if (dVar1 <= dVar7) {
      bVar3 = dVar7 <= dVar2;
      goto LAB_0019e06f;
    }
  }
  else if ((dVar1 <= dVar7) || (dVar7 <= dVar2)) {
    bVar3 = dVar2 != -3.141592653589793 || dVar1 != 3.141592653589793;
LAB_0019e06f:
    if (bVar3) {
      return;
    }
  }
  if ((((dVar1 != 3.141592653589793) || (NAN(dVar1))) || (dVar2 != -3.141592653589793)) ||
     (NAN(dVar2))) {
    uVar5 = -(ulong)(dVar1 - dVar7 < 0.0);
    uVar6 = -(ulong)(dVar7 - dVar2 < 0.0);
    if ((double)(~uVar6 & (ulong)(dVar7 - dVar2) |
                (ulong)((dVar7 + 3.141592653589793) - (dVar2 + -3.141592653589793)) & uVar6) <=
        (double)(~uVar5 & (ulong)(dVar1 - dVar7) |
                (ulong)((dVar1 + 3.141592653589793) - (dVar7 + -3.141592653589793)) & uVar5)) {
      (this->bounds_).c_[1] = dVar7;
      bVar3 = false;
      if ((p == -3.141592653589793 || ABS(p) <= 3.141592653589793) &&
         (bVar3 = false, ABS(dVar1) <= 3.141592653589793)) {
        bVar3 = dVar7 == 3.141592653589793 || dVar1 != -3.141592653589793;
      }
      if (!bVar3) {
        S2LogMessage::S2LogMessage
                  (&SStack_58,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.h"
                   ,0x103,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (SStack_58.stream_,"Check failed: is_valid() ",0x19);
        goto LAB_0019e37b;
      }
    }
    else {
      bVar4 = ABS(dVar2) <= 3.141592653589793 &&
              (ABS(p) <= 3.141592653589793 || p == -3.141592653589793);
      (this->bounds_).c_[0] = dVar7;
      bVar3 = dVar7 == 3.141592653589793;
      if (dVar2 != -3.141592653589793) {
        bVar3 = bVar4;
      }
      if (NAN(dVar2)) {
        bVar3 = bVar4;
      }
      if (ABS(dVar2) > 3.141592653589793 || ABS(p) > 3.141592653589793 && p != -3.141592653589793) {
        bVar3 = bVar4;
      }
      if (!bVar3) {
        S2LogMessage::S2LogMessage
                  (&SStack_58,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.h"
                   ,0xfe,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (SStack_58.stream_,"Check failed: is_valid() ",0x19);
LAB_0019e37b:
        abort();
      }
    }
  }
  else {
    (this->bounds_).c_[1] = dVar7;
    bVar3 = false;
    if ((p == -3.141592653589793 || 3.141592653589793 >= ABS(p)) &&
       (bVar3 = false, ABS(dVar1) <= 3.141592653589793)) {
      bVar3 = dVar7 == 3.141592653589793 || dVar1 != -3.141592653589793;
    }
    if (!bVar3) {
      uStack_40 = 0;
      local_48 = dVar7;
      S2LogMessage::S2LogMessage
                (&local_30,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.h"
                 ,0x103,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_30.stream_,"Check failed: is_valid() ",0x19);
      dVar7 = local_48;
      if (!bVar3) goto LAB_0019e37b;
    }
    (this->bounds_).c_[0] = dVar7;
    if ((p != -3.141592653589793 && 3.141592653589793 < ABS(p)) ||
       (dVar1 = (this->bounds_).c_[1], 3.141592653589793 < ABS(dVar1))) {
      bVar3 = false;
    }
    else if ((dVar1 != -3.141592653589793) || (NAN(dVar1))) {
      bVar3 = true;
    }
    else {
      bVar3 = dVar7 == 3.141592653589793;
    }
    if (!bVar3) {
      S2LogMessage::S2LogMessage
                (&SStack_58,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.h"
                 ,0xfe,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_58.stream_,"Check failed: is_valid() ",0x19);
      goto LAB_0019e37b;
    }
  }
  return;
}

Assistant:

void S1Interval::AddPoint(double p) {
  S2_DCHECK_LE(fabs(p), M_PI);
  if (p == -M_PI) p = M_PI;

  if (FastContains(p)) return;
  if (is_empty()) {
    set_hi(p);
    set_lo(p);
  } else {
    // Compute distance from p to each endpoint.
    double dlo = PositiveDistance(p, lo());
    double dhi = PositiveDistance(hi(), p);
    if (dlo < dhi) {
      set_lo(p);
    } else {
      set_hi(p);
    }
    // Adding a point can never turn a non-full interval into a full one.
  }
}